

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

CharIterator * __thiscall
absl::lts_20250127::Cord::Find(CharIterator *__return_storage_ptr__,Cord *this,string_view needle)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong size_to_compare;
  CharIterator *this_00;
  size_t *psVar6;
  byte bVar7;
  ChunkIterator in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  CharIterator local_c0;
  
  size_to_compare = needle._M_len;
  bVar7 = 0;
  if (size_to_compare == 0) {
LAB_01032730:
    CharIterator::CharIterator(__return_storage_ptr__,this);
  }
  else {
    bVar1 = (this->contents_).data_.rep_.field_0.data[0];
    uVar3 = (ulong)(char)bVar1;
    if ((uVar3 & 1) == 0) {
      uVar4 = uVar3 >> 1;
    }
    else {
      uVar4 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (size_to_compare <= uVar4) {
      if ((bVar1 & 1) == 0) {
        uVar4 = uVar3 >> 1;
      }
      else {
        uVar4 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
      }
      if (uVar4 != size_to_compare) {
        CharIterator::CharIterator(&local_c0,this);
        this_00 = &local_c0;
        psVar6 = (size_t *)&stack0xfffffffffffffe98;
        for (lVar5 = 0x13; lVar5 != 0; lVar5 = lVar5 + -1) {
          *psVar6 = (this_00->chunk_iterator_).current_chunk_._M_len;
          this_00 = (CharIterator *)((long)this_00 + ((ulong)bVar7 * -2 + 1) * 8);
          psVar6 = psVar6 + (ulong)bVar7 * -2 + 1;
        }
        FindImpl(__return_storage_ptr__,(Cord *)this_00,(CharIterator)in_stack_fffffffffffffe98,
                 needle);
        return __return_storage_ptr__;
      }
      if ((uVar3 & 1) == 0) {
        uVar3 = uVar3 >> 1;
      }
      else {
        uVar3 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
      }
      if ((uVar3 == size_to_compare) &&
         (local_d0._M_len = size_to_compare, local_d0._M_str = needle._M_str,
         bVar2 = GenericCompare<bool,std::basic_string_view<char,std::char_traits<char>>>
                           (this,&local_d0,size_to_compare), bVar2)) goto LAB_01032730;
    }
    memset(__return_storage_ptr__,0,0x98);
    (__return_storage_ptr__->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
  }
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::Find(absl::string_view needle) const {
  if (needle.empty()) {
    return char_begin();
  }
  if (needle.size() > size()) {
    return char_end();
  }
  if (needle.size() == size()) {
    return *this == needle ? char_begin() : char_end();
  }
  return FindImpl(char_begin(), needle);
}